

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_Duplicate(cJSON *item,cJSON_bool recurse)

{
  char *pcVar1;
  cJSON *item_00;
  size_t sVar2;
  char *pcVar3;
  cJSON *pcVar4;
  cJSON *item_01;
  cJSON *pcVar5;
  
  if ((item == (cJSON *)0x0) ||
     (item_00 = (cJSON *)(*global_hooks.allocate)(0x40), item_00 == (cJSON *)0x0)) {
    item_00 = (cJSON *)0x0;
LAB_0010ce9f:
    if (item_00 != (cJSON *)0x0) {
      cJSON_Delete(item_00);
    }
    item_00 = (cJSON *)0x0;
  }
  else {
    item_00->valuedouble = 0.0;
    item_00->string = (char *)0x0;
    item_00->valuestring = (char *)0x0;
    *(undefined8 *)&item_00->valueint = 0;
    item_00->child = (cJSON *)0x0;
    *(undefined8 *)&item_00->type = 0;
    item_00->next = (cJSON *)0x0;
    item_00->prev = (cJSON *)0x0;
    item_00->type = item->type & 0xfffffeff;
    item_00->valueint = item->valueint;
    item_00->valuedouble = item->valuedouble;
    pcVar1 = item->valuestring;
    if (pcVar1 != (char *)0x0) {
      sVar2 = strlen(pcVar1);
      pcVar3 = (char *)(*global_hooks.allocate)(sVar2 + 1);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        memcpy(pcVar3,pcVar1,sVar2 + 1);
      }
      item_00->valuestring = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_0010ce9f;
    }
    pcVar1 = item->string;
    if (pcVar1 != (char *)0x0) {
      pcVar3 = pcVar1;
      if ((item->type & 0x200) == 0) {
        sVar2 = strlen(pcVar1);
        pcVar3 = (char *)(*global_hooks.allocate)(sVar2 + 1);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          memcpy(pcVar3,pcVar1,sVar2 + 1);
        }
      }
      item_00->string = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_0010ce9f;
    }
    if (recurse != 0) {
      item_01 = item->child;
      if (item_01 == (cJSON *)0x0) {
        pcVar4 = (cJSON *)0x0;
      }
      else {
        pcVar5 = (cJSON *)0x0;
        do {
          pcVar4 = cJSON_Duplicate(item_01,1);
          if (pcVar4 == (cJSON *)0x0) goto LAB_0010ce9f;
          if (pcVar5 == (cJSON *)0x0) {
            item_00->child = pcVar4;
          }
          else {
            pcVar5->next = pcVar4;
            pcVar4->prev = pcVar5;
          }
          item_01 = item_01->next;
          pcVar5 = pcVar4;
        } while (item_01 != (cJSON *)0x0);
      }
      if (item_00->child != (cJSON *)0x0) {
        item_00->child->prev = pcVar4;
      }
    }
  }
  return item_00;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_Duplicate(const cJSON *item, cJSON_bool recurse)
{
    cJSON *newitem = NULL;
    cJSON *child = NULL;
    cJSON *next = NULL;
    cJSON *newchild = NULL;

    /* Bail on bad ptr */
    if (!item)
    {
        goto fail;
    }
    /* Create new item */
    newitem = cJSON_New_Item(&global_hooks);
    if (!newitem)
    {
        goto fail;
    }
    /* Copy over all vars */
    newitem->type = item->type & (~cJSON_IsReference);
    newitem->valueint = item->valueint;
    newitem->valuedouble = item->valuedouble;
    if (item->valuestring)
    {
        newitem->valuestring = (char*)cJSON_strdup((unsigned char*)item->valuestring, &global_hooks);
        if (!newitem->valuestring)
        {
            goto fail;
        }
    }
    if (item->string)
    {
        newitem->string = (item->type&cJSON_StringIsConst) ? item->string : (char*)cJSON_strdup((unsigned char*)item->string, &global_hooks);
        if (!newitem->string)
        {
            goto fail;
        }
    }
    /* If non-recursive, then we're done! */
    if (!recurse)
    {
        return newitem;
    }
    /* Walk the ->next chain for the child. */
    child = item->child;
    while (child != NULL)
    {
        newchild = cJSON_Duplicate(child, true); /* Duplicate (with recurse) each item in the ->next chain */
        if (!newchild)
        {
            goto fail;
        }
        if (next != NULL)
        {
            /* If newitem->child already set, then crosswire ->prev and ->next and move on */
            next->next = newchild;
            newchild->prev = next;
            next = newchild;
        }
        else
        {
            /* Set newitem->child and move to it */
            newitem->child = newchild;
            next = newchild;
        }
        child = child->next;
    }
    if (newitem && newitem->child)
    {
        newitem->child->prev = newchild;
    }

    return newitem;

fail:
    if (newitem != NULL)
    {
        cJSON_Delete(newitem);
    }

    return NULL;
}